

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O3

void __thiscall duckdb::TupleDataSegment::Unpin(TupleDataSegment *this)

{
  pointer pBVar1;
  pointer pBVar2;
  int iVar3;
  pointer pBVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->pinned_handles_lock);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  pBVar1 = (this->pinned_row_handles).
           super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
           super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2 = (this->pinned_row_handles).
           super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
           super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar4 = pBVar1;
  if (pBVar2 != pBVar1) {
    do {
      BufferHandle::~BufferHandle(pBVar4);
      pBVar4 = pBVar4 + 1;
    } while (pBVar4 != pBVar2);
    (this->pinned_row_handles).
    super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
    super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar1;
  }
  pBVar1 = (this->pinned_heap_handles).
           super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
           super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2 = (this->pinned_heap_handles).
           super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
           super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pBVar4 = pBVar1;
  if (pBVar2 != pBVar1) {
    do {
      BufferHandle::~BufferHandle(pBVar4);
      pBVar4 = pBVar4 + 1;
    } while (pBVar4 != pBVar2);
    (this->pinned_heap_handles).
    super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
    super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->pinned_handles_lock);
  return;
}

Assistant:

void TupleDataSegment::Unpin() {
	lock_guard<mutex> guard(pinned_handles_lock);
	pinned_row_handles.clear();
	pinned_heap_handles.clear();
}